

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O0

void __thiscall
DReachabilityPropagator::reverseDFStoBorder
          (DReachabilityPropagator *this,int u,vector<bool,_std::allocator<bool>_> *v,
          vector<bool,_std::allocator<bool>_> *my_side,vec<Lit> *expl,int skip_n)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  reference piVar4;
  vector<bool,_std::allocator<bool>_> *in_RCX;
  undefined8 in_RDX;
  int in_ESI;
  vector<bool,_std::allocator<bool>_> *in_RDI;
  GraphPropagator *in_R8;
  int in_R9D;
  reference rVar5;
  int o;
  int ie;
  iterator __end1;
  iterator __begin1;
  value_type *__range1;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  GraphPropagator *in_stack_ffffffffffffff50;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff58;
  vec<Lit> *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  byte bVar6;
  reference local_88;
  int local_78;
  int local_74;
  reference local_70;
  int local_5c;
  int *local_58;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_50;
  reference local_48;
  undefined4 in_stack_ffffffffffffffd0;
  GraphPropagator *pGVar7;
  vector<bool,_std::allocator<bool>_> *pvVar8;
  undefined4 in_stack_fffffffffffffff0;
  
  rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                    (in_RDI,CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  std::_Bit_reference::operator=((_Bit_reference *)&stack0xffffffffffffffc0,true);
  local_48 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)&in_RDI[10].super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset,
                          (long)in_ESI);
  local_50._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  local_58 = (int *)std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)
                               CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                            in_stack_ffffffffffffff50,
                            (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)), bVar1) {
    piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_50);
    local_5c = *piVar4;
    GraphPropagator::getEdgeVar(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    bVar1 = BoolView::isFixed((BoolView *)0x2b0aae);
    bVar6 = 0;
    if (bVar1) {
      GraphPropagator::getEdgeVar(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      bVar1 = BoolView::isFalse((BoolView *)in_stack_ffffffffffffff50);
      bVar6 = 0;
      if (bVar1) {
        in_stack_ffffffffffffff60 =
             *(vec<Lit> **)
              &in_RDI[3].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
               ._M_start.super__Bit_iterator_base._M_offset;
        iVar2 = GraphPropagator::getTail(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
        uVar3 = (**(code **)(*(long *)in_stack_ffffffffffffff60 + 0x38))
                          (in_stack_ffffffffffffff60,iVar2);
        bVar6 = 0;
        if ((uVar3 & 1) != 0) {
          pvVar8 = in_RCX;
          GraphPropagator::getTail(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
          local_70 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               (in_RDI,CONCAT17(bVar6,in_stack_ffffffffffffff68));
          bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_70);
          bVar6 = bVar1 ^ 0xff;
          in_stack_ffffffffffffff58 = in_RCX;
          in_RCX = pvVar8;
        }
      }
    }
    if ((bVar6 & 1) == 0) {
      local_78 = GraphPropagator::getTail(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      in_stack_ffffffffffffff4c = CONCAT13(1,(int3)in_stack_ffffffffffffff4c);
      if (local_78 != in_R9D) {
        local_88 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             (in_RDI,CONCAT17(bVar6,in_stack_ffffffffffffff68));
        bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_88);
        in_stack_ffffffffffffff4c = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff4c);
      }
      if ((char)((uint)in_stack_ffffffffffffff4c >> 0x18) == '\0') {
        reverseDFStoBorder((DReachabilityPropagator *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                           (int)((ulong)in_RDX >> 0x20),in_RCX,
                           (vector<bool,_std::allocator<bool>_> *)in_R8,
                           (vec<Lit> *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),
                           rVar5._M_mask._4_4_);
      }
    }
    else {
      pGVar7 = in_R8;
      GraphPropagator::getEdgeVar(in_R8,in_stack_ffffffffffffff4c);
      local_74 = (int)BoolView::getValLit((BoolView *)
                                          CONCAT44(in_stack_ffffffffffffff4c,
                                                   in_stack_ffffffffffffff48));
      vec<Lit>::push(in_stack_ffffffffffffff60,(Lit *)in_stack_ffffffffffffff58);
      in_stack_ffffffffffffff50 = in_R8;
      in_R8 = pGVar7;
    }
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_50);
  }
  return;
}

Assistant:

void DReachabilityPropagator::reverseDFStoBorder(int u, std::vector<bool>& v,
																								 std::vector<bool>& my_side, vec<Lit>& expl,
																								 int skip_n) {
	if (DEBUG) {
		std::cout << "Reverse DFS to border from " << u << '\n';
	}
	v[u] = true;
	for (const int ie : in[u]) {
		if (getEdgeVar(ie).isFixed() && getEdgeVar(ie).isFalse() && lt->visited_dfs(getTail(ie)) &&
				!my_side[getTail(ie)]) {
			expl.push(getEdgeVar(ie).getValLit());
			if (DEBUG) {
				std::cout << "Added to explanation for dom/bridge edge:" << ie << '\n';
			}
		} else {
			const int o = getTail(ie);
			if (o == skip_n || v[o]) {
				continue;
			}
			reverseDFStoBorder(o, v, my_side, expl, skip_n);
		}
	}
}